

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O0

void skiwi::compile_is_symbol(asmcode *code,compiler_options *param_2)

{
  skiwi *this;
  uint64_t in_RDX;
  operand local_8c;
  operation local_88 [2];
  operand local_80 [2];
  operation local_78 [2];
  operand local_70;
  operation local_6c [2];
  operand local_64 [2];
  operation local_5c;
  unsigned_long local_58;
  operand local_50 [2];
  operation local_48 [4];
  undefined1 local_38 [8];
  string lab_false;
  compiler_options *param_1_local;
  asmcode *code_local;
  
  this = label;
  label = label + 1;
  lab_false.field_2._8_8_ = param_2;
  label_to_string_abi_cxx11_((string *)local_38,this,in_RDX);
  jump_short_if_arg_is_not_block(code,RCX,RAX,(string *)local_38);
  local_48[0] = AND;
  local_50[1] = 0xb;
  local_50[0] = NUMBER;
  local_58 = 0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_48,local_50 + 1,local_50,&local_58);
  jump_short_if_arg_does_not_point_to_symbol(code,RCX,RCX,(string *)local_38);
  local_5c = MOV;
  local_64[1] = 9;
  local_64[0] = NUMBER;
  local_6c[1] = 0xf;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_5c,local_64 + 1,local_64,(int *)(local_6c + 1));
  local_6c[0] = JMP;
  local_70 = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_6c,&local_70);
  local_78[1] = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_78 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  local_78[0] = MOV;
  local_80[1] = 9;
  local_80[0] = NUMBER;
  local_88[1] = 7;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_78,local_80 + 1,local_80,(int *)(local_88 + 1));
  local_88[0] = JMP;
  local_8c = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_88,&local_8c);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void compile_is_symbol(asmcode& code, const compiler_options&)
  {
  auto lab_false = label_to_string(label++);
  jump_short_if_arg_is_not_block(code, asmcode::RCX, asmcode::RAX, lab_false);
  code.add(asmcode::AND, asmcode::RCX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  jump_short_if_arg_does_not_point_to_symbol(code, asmcode::RCX, asmcode::RCX, lab_false);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::NUMBER, bool_t);
  code.add(asmcode::JMP, CONTINUE);
  code.add(asmcode::LABEL, lab_false);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::NUMBER, bool_f);
  code.add(asmcode::JMP, CONTINUE);
  }